

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O1

void __thiscall kratos::Simulator::process_stmt(Simulator *this,IfStmt *if_,Var *var)

{
  Var *var_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  optional<unsigned_long> oVar1;
  
  var_00 = (if_->predicate_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (if_->predicate_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  oVar1 = get_value_(this,var_00);
  if ((oVar1.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged &
      oVar1.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload != 0) == 1) {
    process_stmt(this,&((if_->then_body_).
                        super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->super_StmtBlock,var);
  }
  else {
    process_stmt(this,&((if_->else_body_).
                        super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->super_StmtBlock,var);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

void Simulator::process_stmt(kratos::IfStmt *if_, const Var *var) {
    auto target = if_->predicate();
    auto val = get_value_(target.get());
    if (val && (*val)) {
        auto const &then_ = if_->then_body();
        process_stmt(then_.get(), var);
    } else {
        auto const &else_ = if_->else_body();
        process_stmt(else_.get(), var);
    }
}